

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
* __thiscall
nlohmann::detail::
iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
::operator++(iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *this)

{
  iterator *piVar1;
  primitive_iterator_t *ppVar2;
  value_t vVar3;
  _Base_ptr p_Var4;
  
  if (this->m_object != (pointer)0x0) {
    vVar3 = this->m_object->m_type;
    if (vVar3 == array) {
      piVar1 = &(this->m_it).array_iterator;
      piVar1->_M_current = piVar1->_M_current + 1;
    }
    else if (vVar3 == object) {
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment((this->m_it).object_iterator._M_node);
      (this->m_it).object_iterator._M_node = p_Var4;
    }
    else {
      ppVar2 = &(this->m_it).primitive_iterator;
      ppVar2->m_it = ppVar2->m_it + 1;
    }
    return this;
  }
  __assert_fail("m_object != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinygltf/json.hpp",0x2eb1
                ,
                "iter_impl<BasicJsonType> &nlohmann::detail::iter_impl<nlohmann::basic_json<>>::operator++() [BasicJsonType = nlohmann::basic_json<>]"
               );
}

Assistant:

iter_impl& operator++()
    {
        JSON_ASSERT(m_object != nullptr);

        switch (m_object->m_type)
        {
            case value_t::object:
            {
                std::advance(m_it.object_iterator, 1);
                break;
            }

            case value_t::array:
            {
                std::advance(m_it.array_iterator, 1);
                break;
            }

            case value_t::null:
            case value_t::string:
            case value_t::boolean:
            case value_t::number_integer:
            case value_t::number_unsigned:
            case value_t::number_float:
            case value_t::binary:
            case value_t::discarded:
            default:
            {
                ++m_it.primitive_iterator;
                break;
            }
        }

        return *this;
    }